

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O2

Constraint * __thiscall
spvtools::opt::LoopDependenceAnalysis::
make_constraint<spvtools::opt::DependencePoint,spvtools::opt::SENode*,spvtools::opt::SENode*,spvtools::opt::Loop_const*>
          (LoopDependenceAnalysis *this,SENode **args,SENode **args_1,Loop **args_2)

{
  SENode *pSVar1;
  SENode *pSVar2;
  __uniq_ptr_impl<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>
  local_30;
  
  local_30._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
  .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>)
       ::operator_new(0x20);
  pSVar1 = *args;
  pSVar2 = *args_1;
  *(Loop **)((long)local_30._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
                   .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl + 8) =
       *args_2;
  *(undefined ***)
   local_30._M_t.
   super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
   .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl = &PTR_GetType_00a71438;
  *(SENode **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
          .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl + 0x10) = pSVar1;
  *(SENode **)
   ((long)local_30._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
          .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl + 0x18) = pSVar2;
  std::__cxx11::
  list<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
  ::push_back(&this->constraints_,(value_type *)&local_30);
  if ((_Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
       )local_30._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
        .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl != (Constraint *)0x0
     ) {
    (**(code **)(*(long *)local_30._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Constraint_*,_std::default_delete<spvtools::opt::Constraint>_>
                          .super__Head_base<0UL,_spvtools::opt::Constraint_*,_false>._M_head_impl +
                0x10))();
  }
  return (Constraint *)
         (this->constraints_).
         super__List_base<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>,_std::allocator<std::unique_ptr<spvtools::opt::Constraint,_std::default_delete<spvtools::opt::Constraint>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

Constraint* make_constraint(Args&&... args) {
    constraints_.push_back(
        std::unique_ptr<Constraint>(new T(std::forward<Args>(args)...)));

    return constraints_.back().get();
  }